

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  pal_result pVar1;
  char *pcVar2;
  float fVar3;
  float t_c;
  pal_result result;
  unsigned_short temperature;
  
  result = PAL_OK;
  pVar1 = pal_temperature_get((unsigned_short *)((long)&t_c + 2));
  if (pVar1 != PAL_OK) {
    return pVar1;
  }
  fVar3 = pal_temperature_to_celsius(t_c._2_2_);
  pcVar2 = pal_version_get_string();
  printf("My current PAL version is %s\r\n",pcVar2);
  printf("My current temperature is %.1fc\r\n",(double)fVar3);
  do {
    temperature_monitor();
    pal_sleep(1000);
  } while( true );
}

Assistant:

int main()
{
    unsigned short temperature;

    pal_result result = pal_temperature_get(&temperature);
    if (result != PAL_OK) return (int)result;

    float t_c = pal_temperature_to_celsius(temperature);

    printf("My current PAL version is %s\r\n", pal_version_get_string());

    printf("My current temperature is %.1fc\r\n", t_c);

    while (1) {
        temperature_monitor();
        pal_sleep(1000);
    }

    return 0;
}